

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_rts(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *s_00;
  TCGv_i32 addr;
  TCGContext_conflict2 *pTVar2;
  TCGTemp *pTVar3;
  TCGv_i32 *ppTVar4;
  TCGv_i32 *ppTVar5;
  TCGContext_conflict2 *tcg_ctx;
  
  s_00 = s->uc->tcg_ctx;
  ppTVar5 = s->writeback;
  ppTVar4 = s_00->cpu_aregs;
  if ((char)s->writeback_mask < '\0') {
    ppTVar4 = ppTVar5;
  }
  addr = ppTVar4[7];
  uVar1 = ((s->base).tb)->flags;
  pTVar3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  tcg_gen_qemu_ld_i32_m68k
            (s_00,(TCGv_i32)((long)pTVar3 - (long)s_00),addr,(ulong)((uVar1 >> 0xd & 1) == 0),
             MO_BEUL);
  if ((s->writeback_mask & 0x80) == 0) {
    pTVar2 = s->uc->tcg_ctx;
    ppTVar4 = pTVar2->cpu_aregs;
    ppTVar5 = pTVar2->cpu_aregs;
  }
  else {
    ppTVar4 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(s_00,ppTVar4[7],ppTVar5[7],4);
  gen_jmp(s,(TCGv_i32)((long)pTVar3 - (long)s_00));
  return;
}

Assistant:

DISAS_INSN(rts)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    tmp = gen_load(s, OS_LONG, QREG_SP, 0, IS_USER(s));
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, QREG_SP, 4);
    gen_jmp(s, tmp);
}